

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&>::
operator>=(result *__return_storage_ptr__,
          expression_lhs<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>const&>
          *this,basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  lest *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  allocator local_f1;
  string local_f0 [32];
  basic_string_view<char,_std::char_traits<char>_> local_d0 [2];
  string local_b0;
  text local_90;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  bool local_49;
  result local_48;
  string *local_20;
  basic_string_view<char,_std::char_traits<char>_> *rhs_local;
  expression_lhs<const_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_&>
  *this_local;
  
  local_20 = (string *)rhs;
  rhs_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  this_local = (expression_lhs<const_nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>_&>
                *)__return_storage_ptr__;
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_60,*(basic_string_view<char,_std::char_traits<char>_> **)this);
  nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_70,(basic_string_view<char,_std::char_traits<char>_> *)local_20);
  local_49 = nonstd::sv_lite::operator>=(&local_60,&local_70);
  this_00 = *(lest **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,">=",&local_f1);
  std::__cxx11::string::string((string *)local_d0,local_f0);
  to_string<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>>
            (&local_b0,this_00,local_d0,local_20,in_R8);
  std::__cxx11::string::string((string *)&local_90,(string *)&local_b0);
  result::result<bool>(&local_48,&local_49,&local_90);
  result::result(__return_storage_ptr__,&local_48);
  result::~result(&local_48);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  return __return_storage_ptr__;
}

Assistant:

result operator>=( R const & rhs ) { return result( lhs >= rhs, to_string( lhs, ">=", rhs ) ); }